

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O3

string * tinygltf::MimeToExt(string *__return_storage_ptr__,string *mimeType)

{
  int iVar1;
  string *extraout_RAX;
  char *pcVar2;
  char *pcVar3;
  
  iVar1 = std::__cxx11::string::compare((char *)mimeType);
  if (iVar1 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "jpg";
    pcVar2 = "";
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)mimeType);
    if (iVar1 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "png";
      pcVar2 = "";
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)mimeType);
      if (iVar1 == 0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "bmp";
        pcVar2 = "";
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)mimeType);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if (iVar1 == 0) {
          pcVar3 = "gif";
          pcVar2 = "";
        }
        else {
          pcVar2 = "";
          pcVar3 = "";
        }
      }
    }
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return extraout_RAX;
}

Assistant:

static std::string MimeToExt(const std::string &mimeType) {
  if (mimeType == "image/jpeg") {
    return "jpg";
  } else if (mimeType == "image/png") {
    return "png";
  } else if (mimeType == "image/bmp") {
    return "bmp";
  } else if (mimeType == "image/gif") {
    return "gif";
  }

  return "";
}